

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode setup_connection_internals(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  uint uVar2;
  Curl_handler *pCVar3;
  char **ppcVar4;
  char *__s;
  size_t n;
  ulong uVar5;
  
  pCVar3 = conn->handler;
  if (pCVar3->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
    CVar1 = (*pCVar3->setup_connection)(data,conn);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pCVar3 = conn->handler;
  }
  if ((conn->primary).remote_port < 0) {
    (conn->primary).remote_port = pCVar3->defport;
  }
  uVar2 = SUB84(conn->bits,0);
  if ((uVar2 & 9) == 1) {
    ppcVar4 = &(conn->http_proxy).host.name;
    uVar5 = (ulong)(uint)(conn->primary).remote_port;
  }
  else {
    uVar5 = (ulong)(uint)conn->remote_port;
    if ((uVar2 >> 8 & 1) == 0) {
      ppcVar4 = &(conn->host).name;
    }
    else {
      ppcVar4 = &(conn->conn_to_host).name;
    }
  }
  CVar1 = CURLE_OK;
  __s = curl_maprintf("%u/%d/%s",(ulong)conn->scope_id,uVar5,*ppcVar4);
  conn->destination = __s;
  if (__s == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    n = strlen(__s);
    Curl_strntolower(__s,__s,n);
  }
  return CVar1;
}

Assistant:

static CURLcode setup_connection_internals(struct Curl_easy *data,
                                           struct connectdata *conn)
{
  const struct Curl_handler *p;
  const char *hostname;
  int port;
  CURLcode result;

  /* Perform setup complement if some. */
  p = conn->handler;

  if(p->setup_connection) {
    result = (*p->setup_connection)(data, conn);

    if(result)
      return result;

    p = conn->handler;              /* May have changed. */
  }

  if(conn->primary.remote_port < 0)
    /* we check for -1 here since if proxy was detected already, this was
       likely already set to the proxy port */
    conn->primary.remote_port = p->defport;

  /* Now create the destination name */
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    hostname = conn->http_proxy.host.name;
    port = conn->primary.remote_port;
  }
  else
#endif
  {
    port = conn->remote_port;
    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;
  }

#ifdef USE_IPV6
  conn->destination = aprintf("%u/%d/%s", conn->scope_id, port, hostname);
#else
  conn->destination = aprintf("%d/%s", port, hostname);
#endif
  if(!conn->destination)
    return CURLE_OUT_OF_MEMORY;

  Curl_strntolower(conn->destination, conn->destination,
                   strlen(conn->destination));

  return CURLE_OK;
}